

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButtonPrivate::click(QAbstractButtonPrivate *this)

{
  QWidget *this_00;
  QWidget *pQVar1;
  int *piVar2;
  byte bVar3;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar3 = this->field_0x28c;
  this->field_0x28c = bVar3 & 0xcf | 0x20;
  if (((bVar3 & 2) == 0) || (pQVar1 = &queryCheckedButton(this)->super_QWidget, pQVar1 != this_00))
  {
    if (this_00 == (QWidget *)0x0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_00->super_QObject);
    }
LAB_003c4a6a:
    (**(code **)(*(long *)this_00 + 0x1b0))(this_00);
    if ((piVar2 == (int *)0x0) || (piVar2[1] == 0)) goto LAB_003c4b10;
  }
  else {
    if (this->group == (QButtonGroup *)0x0) {
      bVar3 = (byte)this->field_0x28c >> 3 & 1;
    }
    else {
      bVar3 = *(byte *)(*(long *)&this->group->field_0x8 + 0xa0);
    }
    if (this_00 == (QWidget *)0x0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_00->super_QObject);
    }
    if (bVar3 == 0) goto LAB_003c4a6a;
  }
  this->field_0x28c = this->field_0x28c & 0xdf;
  QWidget::update(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  QWidget::repaint(this_00);
  if (piVar2 != (int *)0x0) {
    if (piVar2[1] != 0) {
      emitReleased(this);
    }
    if ((piVar2 != (int *)0x0) && (piVar2[1] != 0)) {
      emitClicked(this);
    }
  }
LAB_003c4b10:
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
      return;
    }
  }
  return;
}

Assistant:

void QAbstractButtonPrivate::click()
{
    Q_Q(QAbstractButton);

    down = false;
    blockRefresh = true;
    bool changeState = true;
    if (checked && queryCheckedButton() == q) {
        // the checked button of an exclusive or autoexclusive group cannot be unchecked
#if QT_CONFIG(buttongroup)
        if (group ? group->d_func()->exclusive : autoExclusive)
#else
        if (autoExclusive)
#endif
            changeState = false;
    }

    QPointer<QAbstractButton> guard(q);
    if (changeState) {
        q->nextCheckState();
        if (!guard)
            return;
    }
    blockRefresh = false;
    refresh();
    q->repaint();
    if (guard)
        emitReleased();
    if (guard)
        emitClicked();
}